

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O0

BOOL __thiscall Js::ModuleNamespace::IsWritable(ModuleNamespace *this,PropertyId propertyId)

{
  bool bVar1;
  ScriptContext *this_00;
  ThreadContext *this_01;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  **ppBVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_02;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar3;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_03;
  undefined1 local_40 [8];
  ModuleNameRecord moduleNameRecord;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> propertyDescriptor;
  PropertyId propertyId_local;
  ModuleNamespace *this_local;
  
  propertyDescriptor._0_4_ = propertyId;
  unique0x10000189 = this;
  SimpleDictionaryPropertyDescriptor<int>::SimpleDictionaryPropertyDescriptor
            ((SimpleDictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4));
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  moduleNameRecord._8_8_ = ThreadContext::GetPropertyName(this_01,propertyDescriptor._0_4_);
  bVar1 = PropertyRecord::IsSymbol((PropertyRecord *)moduleNameRecord._8_8_);
  if (bVar1) {
    this_local._4_4_ =
         DynamicObject::IsWritable(&this->super_DynamicObject,propertyDescriptor._0_4_);
  }
  else {
    ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&this->propertyMap);
    if (*ppBVar2 !=
        (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
         *)0x0) {
      this_02 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                ::operator->(&this->propertyMap);
      bVar1 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::TryGetValue<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                          *)this_02,(PropertyRecord **)&moduleNameRecord.bindingName,
                         (SimpleDictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4));
      if (bVar1) {
        return (uint)((propertyRecord._5_1_ & 4) != 0);
      }
    }
    ppBVar3 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&this->unambiguousNonLocalExports);
    if (*ppBVar3 !=
        (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      ModuleNameRecord::ModuleNameRecord((ModuleNameRecord *)local_40);
      this_03 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&this->unambiguousNonLocalExports);
      bVar1 = JsUtil::
              BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<int>(this_03,(int *)&propertyDescriptor,(ModuleNameRecord *)local_40);
      if (bVar1) {
        return 1;
      }
    }
    this_local._4_4_ =
         DynamicObject::IsWritable(&this->super_DynamicObject,propertyDescriptor._0_4_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleNamespace::IsWritable(PropertyId propertyId)
    {
        SimpleDictionaryPropertyDescriptor<BigPropertyIndex> propertyDescriptor;
        const Js::PropertyRecord* propertyRecord = GetScriptContext()->GetThreadContext()->GetPropertyName(propertyId);
        if (propertyRecord->IsSymbol())
        {
            return this->DynamicObject::IsWritable(propertyId);
        }

        if (propertyMap != nullptr && propertyMap->TryGetValue(propertyRecord, &propertyDescriptor))
        {
            return !!(propertyDescriptor.Attributes & PropertyWritable);
        }

        if (unambiguousNonLocalExports != nullptr)
        {
            ModuleNameRecord moduleNameRecord;
            if (unambiguousNonLocalExports->TryGetValue(propertyId, &moduleNameRecord))
            {
                return !!(PropertyModuleNamespaceDefault & PropertyWritable);
            }
        }

        return DynamicObject::IsWritable(propertyId);
    }